

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

ASN1_OCTET_STRING * a2i_IPADDRESS_NC(char *ipasc)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iplen2;
  int iplen1;
  char *p;
  char *iptmp;
  uchar ipout [32];
  ASN1_OCTET_STRING *local_20;
  ASN1_OCTET_STRING *ret;
  char *ipasc_local;
  
  local_20 = (ASN1_OCTET_STRING *)0x0;
  pcVar3 = strchr(ipasc,0x2f);
  if ((pcVar3 != (char *)0x0) && (p = OPENSSL_strdup(ipasc), p != (char *)0x0)) {
    p[(long)pcVar3 - (long)ipasc] = '\0';
    iVar1 = x509v3_a2i_ipadd((uint8_t *)&iptmp,p);
    if (iVar1 != 0) {
      iVar2 = x509v3_a2i_ipadd(ipout + (long)iVar1 + -8,p + ((long)pcVar3 - (long)ipasc) + 1);
      OPENSSL_free(p);
      p = (char *)0x0;
      if ((((iVar2 != 0) && (iVar1 == iVar2)) &&
          (local_20 = ASN1_OCTET_STRING_new(), local_20 != (ASN1_OCTET_STRING *)0x0)) &&
         (iVar1 = ASN1_OCTET_STRING_set(local_20,(uchar *)&iptmp,iVar1 + iVar2), iVar1 != 0)) {
        return local_20;
      }
    }
    OPENSSL_free(p);
    ASN1_OCTET_STRING_free(local_20);
  }
  return (ASN1_OCTET_STRING *)0x0;
}

Assistant:

ASN1_OCTET_STRING *a2i_IPADDRESS_NC(const char *ipasc) {
  ASN1_OCTET_STRING *ret = NULL;
  unsigned char ipout[32];
  char *iptmp = NULL, *p;
  int iplen1, iplen2;
  // FIXME: yes, this function takes a const pointer and writes to it!
  p = const_cast<char *>(strchr(ipasc, '/'));
  if (!p) {
    return NULL;
  }
  iptmp = OPENSSL_strdup(ipasc);
  if (!iptmp) {
    return NULL;
  }
  p = iptmp + (p - ipasc);
  *p++ = 0;

  iplen1 = x509v3_a2i_ipadd(ipout, iptmp);

  if (!iplen1) {
    goto err;
  }

  iplen2 = x509v3_a2i_ipadd(ipout + iplen1, p);

  OPENSSL_free(iptmp);
  iptmp = NULL;

  if (!iplen2 || (iplen1 != iplen2)) {
    goto err;
  }

  ret = ASN1_OCTET_STRING_new();
  if (!ret) {
    goto err;
  }
  if (!ASN1_OCTET_STRING_set(ret, ipout, iplen1 + iplen2)) {
    goto err;
  }

  return ret;

err:
  OPENSSL_free(iptmp);
  ASN1_OCTET_STRING_free(ret);
  return NULL;
}